

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-filepath.cc
# Opt level: O2

void __thiscall testing::internal::FilePath::Normalize(FilePath *this)

{
  char *pcVar1;
  char *pcVar2;
  char cVar3;
  char *pcVar4;
  
  pcVar1 = (this->pathname_)._M_dataplus._M_p;
  pcVar2 = pcVar1;
  pcVar4 = pcVar1;
  for (; pcVar1 != pcVar2 + (this->pathname_)._M_string_length; pcVar1 = pcVar1 + 1) {
    cVar3 = *pcVar1;
    if (((cVar3 != '/') || (cVar3 = '/', pcVar4 == pcVar2)) || (pcVar4[-1] != '/')) {
      *pcVar4 = cVar3;
      pcVar4 = pcVar4 + 1;
    }
    pcVar2 = (this->pathname_)._M_dataplus._M_p;
  }
  std::__cxx11::string::erase();
  return;
}

Assistant:

void FilePath::Normalize() {
  auto out = pathname_.begin();

  auto i = pathname_.cbegin();
#ifdef GTEST_OS_WINDOWS
  // UNC paths are treated specially
  if (pathname_.end() - i >= 3 && IsPathSeparator(*i) &&
      IsPathSeparator(*(i + 1)) && !IsPathSeparator(*(i + 2))) {
    *(out++) = kPathSeparator;
    *(out++) = kPathSeparator;
  }
#endif
  while (i != pathname_.end()) {
    const char character = *i;
    if (!IsPathSeparator(character)) {
      *(out++) = character;
    } else if (out == pathname_.begin() || *std::prev(out) != kPathSeparator) {
      *(out++) = kPathSeparator;
    }
    ++i;
  }

  pathname_.erase(out, pathname_.end());
}